

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangecontrols.cpp
# Opt level: O0

QAccessibleInterface * __thiscall
QAccessibleAbstractSpinBox::lineEditIface(QAccessibleAbstractSpinBox *this)

{
  void *pvVar1;
  long in_RDI;
  long in_FS_OFFSET;
  QAbstractSpinBox *in_stack_ffffffffffffffc0;
  QString *in_stack_ffffffffffffffe8;
  QWidget *in_stack_fffffffffffffff0;
  QAccessibleLineEdit *this_00;
  
  this_00 = *(QAccessibleLineEdit **)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0x38) == 0) {
    pvVar1 = operator_new(0x30);
    abstractSpinBox((QAccessibleAbstractSpinBox *)0x7ebbf5);
    QAbstractSpinBox::lineEdit(in_stack_ffffffffffffffc0);
    QString::QString((QString *)0x7ebc0c);
    QAccessibleLineEdit::QAccessibleLineEdit
              (this_00,in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
    *(void **)(in_RDI + 0x38) = pvVar1;
    QString::~QString((QString *)0x7ebc38);
  }
  if (*(QAccessibleLineEdit **)(in_FS_OFFSET + 0x28) == this_00) {
    return *(QAccessibleInterface **)(in_RDI + 0x38);
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *QAccessibleAbstractSpinBox::lineEditIface() const
{
#if QT_CONFIG(lineedit)
    // QAccessibleLineEdit is only used to forward the text functions
    if (!lineEdit)
        lineEdit = new QAccessibleLineEdit(abstractSpinBox()->lineEdit());
    return lineEdit;
#else
    return nullptr;
#endif
}